

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O2

void anon_unknown.dwarf_183ce9::fillPixels<float>
               (Array2D<unsigned_int> *sampleCount,Array2D<float_*> *ph,int width,int height)

{
  uint uVar1;
  float **ppfVar2;
  float *pfVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int x;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  
  Imf_2_5::Array2D<float_*>::resizeErase(ph,(long)height,(long)width);
  uVar4 = 0;
  uVar5 = 0;
  if (0 < width) {
    uVar5 = (ulong)(uint)width;
  }
  uVar9 = (ulong)(uint)height;
  if (height < 1) {
    uVar9 = uVar4;
  }
  for (; uVar4 != uVar9; uVar4 = uVar4 + 1) {
    lVar10 = sampleCount->_sizeY * uVar4;
    lVar8 = ph->_sizeY * uVar4;
    for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
      pfVar3 = (float *)operator_new__((ulong)sampleCount->_data[lVar10 + uVar7] << 2);
      ph->_data[lVar8 + uVar7] = pfVar3;
      uVar1 = sampleCount->_data[lVar10 + uVar7];
      ppfVar2 = ph->_data;
      for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
        ppfVar2[lVar8 + uVar7][uVar6] = (float)(((int)uVar4 * width + (int)uVar7) % 0x801);
      }
    }
  }
  return;
}

Assistant:

void
fillPixels (Array2D<unsigned int>& sampleCount, Array2D<T*> &ph, int width, int height)
{
    ph.resizeErase(height, width);
    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
        {
            ph[y][x] = new T[sampleCount[y][x]];
            for (unsigned int i = 0; i < sampleCount[y][x]; i++)
            {
                //
                // We do this because half cannot store number bigger than 2048 exactly.
                //
                ph[y][x][i] = (y * width + x) % 2049;
            }
        }
}